

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx512::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  size_t *psVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar26 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar38 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar26;
  fVar29 = (time_range->lower - fVar26) / fVar38;
  fVar38 = (time_range->upper - fVar26) / fVar38;
  fVar26 = fVar1 * fVar29;
  auVar33 = vroundss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),9);
  fVar7 = fVar1 * fVar38;
  auVar23 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),10);
  auVar40 = ZEXT816(0) << 0x40;
  auVar25 = vmaxss_avx(auVar33,auVar40);
  auVar35 = vminss_avx(auVar23,ZEXT416((uint)fVar1));
  fVar45 = auVar25._0_4_;
  fVar42 = auVar35._0_4_;
  iVar10 = -1;
  if (-1 < (int)auVar33._0_4_) {
    iVar10 = (int)auVar33._0_4_;
  }
  uVar9 = (int)fVar1 + 1U;
  if ((int)auVar23._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar9 = (int)auVar23._0_4_;
  }
  lVar14 = (long)(int)fVar45;
  uVar11 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar12 = (ulong)uVar11;
  pBVar3 = (this->super_LineSegments).vertices.items;
  pcVar4 = pBVar3[lVar14].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[lVar14].super_RawBufferView.stride;
  lVar18 = sVar5 * uVar12;
  uVar15 = (ulong)(uVar11 + 1);
  lVar16 = sVar5 * uVar15;
  auVar33 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar18),
                       *(undefined1 (*) [16])(pcVar4 + lVar16));
  auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar18),
                       *(undefined1 (*) [16])(pcVar4 + lVar16));
  fVar2 = (this->super_LineSegments).maxRadiusScale;
  auVar35 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)),
                       ZEXT416(*(uint *)(pcVar4 + lVar18 + 0xc)));
  fVar8 = fVar2 * auVar35._0_4_;
  auVar35._4_4_ = fVar8;
  auVar35._0_4_ = fVar8;
  auVar35._8_4_ = fVar8;
  auVar35._12_4_ = fVar8;
  auVar23 = vsubps_avx(auVar33,auVar35);
  auVar31._0_4_ = auVar25._0_4_ + fVar8;
  auVar31._4_4_ = auVar25._4_4_ + fVar8;
  auVar31._8_4_ = auVar25._8_4_ + fVar8;
  auVar31._12_4_ = auVar25._12_4_ + fVar8;
  lVar18 = (long)(int)fVar42;
  pcVar4 = pBVar3[lVar18].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[lVar18].super_RawBufferView.stride;
  lVar17 = sVar5 * uVar12;
  lVar16 = sVar5 * uVar15;
  auVar33 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                       *(undefined1 (*) [16])(pcVar4 + lVar16));
  auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                       *(undefined1 (*) [16])(pcVar4 + lVar16));
  auVar35 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)),
                       ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
  fVar8 = fVar2 * auVar35._0_4_;
  auVar19._4_4_ = fVar8;
  auVar19._0_4_ = fVar8;
  auVar19._8_4_ = fVar8;
  auVar19._12_4_ = fVar8;
  auVar35 = vsubps_avx(auVar33,auVar19);
  auVar33._0_4_ = fVar8 + auVar25._0_4_;
  auVar33._4_4_ = fVar8 + auVar25._4_4_;
  auVar33._8_4_ = fVar8 + auVar25._8_4_;
  auVar33._12_4_ = fVar8 + auVar25._12_4_;
  if (uVar9 - iVar10 == 1) {
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar45)),auVar40);
    fVar26 = auVar25._0_4_;
    fVar1 = 1.0 - fVar26;
    auVar39._0_4_ = fVar26 * auVar35._0_4_;
    auVar39._4_4_ = fVar26 * auVar35._4_4_;
    auVar39._8_4_ = fVar26 * auVar35._8_4_;
    auVar39._12_4_ = fVar26 * auVar35._12_4_;
    auVar37._4_4_ = fVar1;
    auVar37._0_4_ = fVar1;
    auVar37._8_4_ = fVar1;
    auVar37._12_4_ = fVar1;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar39,auVar37,auVar23);
    auVar27._0_4_ = fVar26 * auVar33._0_4_;
    auVar27._4_4_ = fVar26 * auVar33._4_4_;
    auVar27._8_4_ = fVar26 * auVar33._8_4_;
    auVar27._12_4_ = fVar26 * auVar33._12_4_;
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar36;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar27,auVar31,auVar37);
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar36;
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar7)),auVar40);
    fVar26 = auVar25._0_4_;
    fVar1 = 1.0 - fVar26;
    auVar32._0_4_ = fVar26 * auVar23._0_4_;
    auVar32._4_4_ = fVar26 * auVar23._4_4_;
    auVar32._8_4_ = fVar26 * auVar23._8_4_;
    auVar32._12_4_ = fVar26 * auVar23._12_4_;
    auVar30._4_4_ = fVar1;
    auVar30._0_4_ = fVar1;
    auVar30._8_4_ = fVar1;
    auVar30._12_4_ = fVar1;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar35,auVar30,auVar32);
    auVar28._0_4_ = fVar26 * auVar31._0_4_;
    auVar28._4_4_ = fVar26 * auVar31._4_4_;
    auVar28._8_4_ = fVar26 * auVar31._8_4_;
    auVar28._12_4_ = fVar26 * auVar31._12_4_;
    aVar34 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar33,auVar30,auVar28);
  }
  else {
    pcVar4 = pBVar3[lVar14 + 1].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[lVar14 + 1].super_RawBufferView.stride;
    lVar16 = sVar5 * uVar12;
    lVar14 = sVar5 * uVar15;
    auVar24 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar16),
                         *(undefined1 (*) [16])(pcVar4 + lVar14));
    auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar16),
                         *(undefined1 (*) [16])(pcVar4 + lVar14));
    auVar19 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                         ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)));
    fVar8 = auVar19._0_4_ * fVar2;
    auVar20._4_4_ = fVar8;
    auVar20._0_4_ = fVar8;
    auVar20._8_4_ = fVar8;
    auVar20._12_4_ = fVar8;
    auVar24 = vsubps_avx(auVar24,auVar20);
    pcVar4 = pBVar3[lVar18 + -1].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[lVar18 + -1].super_RawBufferView.stride;
    lVar18 = sVar5 * uVar12;
    lVar16 = sVar5 * uVar15;
    auVar19 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar18),
                              *(undefined1 (*) [16])(pcVar4 + lVar16));
    auVar20 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar18),
                              *(undefined1 (*) [16])(pcVar4 + lVar16));
    auVar21 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)),
                             ZEXT416(*(uint *)(pcVar4 + lVar18 + 0xc)));
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar21);
    auVar21 = vbroadcastss_avx512vl(auVar21);
    auVar22 = vsubps_avx512vl(auVar19,auVar21);
    auVar20 = vaddps_avx512vl(auVar20,auVar21);
    auVar19 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar45)),auVar40);
    auVar21 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar19);
    fVar26 = auVar19._0_4_;
    auVar49._0_4_ = fVar26 * auVar24._0_4_;
    auVar49._4_4_ = fVar26 * auVar24._4_4_;
    auVar49._8_4_ = fVar26 * auVar24._8_4_;
    auVar49._12_4_ = fVar26 * auVar24._12_4_;
    auVar19 = vbroadcastss_avx512vl(auVar21);
    auVar23 = vfmadd213ps_avx512vl(auVar23,auVar19,auVar49);
    auVar46._0_4_ = fVar26 * (auVar25._0_4_ + fVar8);
    auVar46._4_4_ = fVar26 * (auVar25._4_4_ + fVar8);
    auVar46._8_4_ = fVar26 * (auVar25._8_4_ + fVar8);
    auVar46._12_4_ = fVar26 * (auVar25._12_4_ + fVar8);
    auVar24 = vfmadd213ps_avx512vl(auVar31,auVar19,auVar46);
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar7)),auVar40);
    auVar40._0_4_ = auVar25._0_4_;
    fVar26 = 1.0 - auVar40._0_4_;
    auVar40._4_4_ = auVar40._0_4_;
    auVar40._8_4_ = auVar40._0_4_;
    auVar40._12_4_ = auVar40._0_4_;
    auVar25 = vmulps_avx512vl(auVar40,auVar22);
    auVar21._4_4_ = fVar26;
    auVar21._0_4_ = fVar26;
    auVar21._8_4_ = fVar26;
    auVar21._12_4_ = fVar26;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar35,auVar21,auVar25);
    auVar25._0_4_ = auVar40._0_4_ * auVar20._0_4_;
    auVar25._4_4_ = auVar40._0_4_ * auVar20._4_4_;
    auVar25._8_4_ = auVar40._0_4_ * auVar20._8_4_;
    auVar25._12_4_ = auVar40._0_4_ * auVar20._12_4_;
    aVar34 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar33,auVar21,auVar25);
    uVar11 = iVar10 + 1;
    if ((int)uVar11 < (int)uVar9) {
      psVar13 = &pBVar3[uVar11].super_RawBufferView.stride;
      auVar25 = auVar24;
      auVar35 = auVar23;
      do {
        fVar41 = ((float)(int)uVar11 / fVar1 - fVar29) / (fVar38 - fVar29);
        fVar7 = 1.0 - fVar41;
        auVar47._0_4_ = fVar41 * aVar36.m128[0];
        fVar26 = aVar36.m128[1];
        auVar47._4_4_ = fVar41 * fVar26;
        fVar42 = aVar36.m128[2];
        auVar47._8_4_ = fVar41 * fVar42;
        fVar8 = aVar36.m128[3];
        auVar47._12_4_ = fVar41 * fVar8;
        auVar43._4_4_ = fVar7;
        auVar43._0_4_ = fVar7;
        auVar43._8_4_ = fVar7;
        auVar43._12_4_ = fVar7;
        auVar31 = vfmadd231ps_fma(auVar47,auVar43,auVar35);
        auVar22._0_4_ = fVar41 * aVar34.m128[0];
        fVar7 = aVar34.m128[1];
        auVar22._4_4_ = fVar41 * fVar7;
        fVar45 = aVar34.m128[2];
        auVar22._8_4_ = fVar41 * fVar45;
        fVar6 = aVar34.m128[3];
        auVar22._12_4_ = fVar41 * fVar6;
        auVar19 = vfmadd231ps_fma(auVar22,auVar25,auVar43);
        pcVar4 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
        lVar18 = *psVar13 * uVar12;
        lVar16 = *psVar13 * uVar15;
        auVar40 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar18),
                             *(undefined1 (*) [16])(pcVar4 + lVar16));
        auVar33 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar18),
                             *(undefined1 (*) [16])(pcVar4 + lVar16));
        auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)),
                             ZEXT416(*(uint *)(pcVar4 + lVar18 + 0xc)));
        fVar41 = auVar23._0_4_ * fVar2;
        auVar48._4_4_ = fVar41;
        auVar48._0_4_ = fVar41;
        auVar48._8_4_ = fVar41;
        auVar48._12_4_ = fVar41;
        auVar23 = vsubps_avx(auVar40,auVar48);
        auVar23 = vsubps_avx(auVar23,auVar31);
        auVar44._0_4_ = auVar33._0_4_ + fVar41;
        auVar44._4_4_ = auVar33._4_4_ + fVar41;
        auVar44._8_4_ = auVar33._8_4_ + fVar41;
        auVar44._12_4_ = auVar33._12_4_ + fVar41;
        auVar33 = vsubps_avx(auVar44,auVar19);
        auVar40 = vminps_avx(auVar23,ZEXT416(0) << 0x20);
        auVar33 = vmaxps_avx(auVar33,ZEXT416(0) << 0x20);
        auVar23._0_4_ = auVar40._0_4_ + auVar35._0_4_;
        auVar23._4_4_ = auVar40._4_4_ + auVar35._4_4_;
        auVar23._8_4_ = auVar40._8_4_ + auVar35._8_4_;
        auVar23._12_4_ = auVar40._12_4_ + auVar35._12_4_;
        aVar36._0_4_ = auVar40._0_4_ + aVar36.m128[0];
        aVar36._4_4_ = auVar40._4_4_ + fVar26;
        aVar36._8_4_ = auVar40._8_4_ + fVar42;
        aVar36._12_4_ = auVar40._12_4_ + fVar8;
        auVar24._0_4_ = auVar33._0_4_ + auVar25._0_4_;
        auVar24._4_4_ = auVar33._4_4_ + auVar25._4_4_;
        auVar24._8_4_ = auVar33._8_4_ + auVar25._8_4_;
        auVar24._12_4_ = auVar33._12_4_ + auVar25._12_4_;
        aVar34._0_4_ = auVar33._0_4_ + aVar34.m128[0];
        aVar34._4_4_ = auVar33._4_4_ + fVar7;
        aVar34._8_4_ = auVar33._8_4_ + fVar45;
        aVar34._12_4_ = auVar33._12_4_ + fVar6;
        uVar11 = uVar11 + 1;
        psVar13 = psVar13 + 7;
        auVar25 = auVar24;
        auVar35 = auVar23;
      } while (uVar9 != uVar11);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar23;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar24;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar36;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar34;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }